

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

bool __thiscall
JsrtDebugManager::EnableAsyncBreak(JsrtDebugManager *this,ScriptContext *scriptContext)

{
  if (scriptContext->isDebugContextInitialized == true) {
    Js::ScriptContext::GetDebugContext(scriptContext);
  }
  return false;
}

Assistant:

bool JsrtDebugManager::EnableAsyncBreak(Js::ScriptContext* scriptContext)
{
    if (!scriptContext->IsDebugContextInitialized())
    {
        // Although the script context exists, it hasn't been fully initialized yet.
        return false;
    }

    Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

    // This can be called when we are already at break
    if (!probeContainer->IsAsyncActivate())
    {
        probeContainer->AsyncActivate(this);

        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetForceInterpreter(true);
        return true;
    }
    return false;
}